

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void cf_sha512_digest_final(cf_sha512_context *ctx,uint8_t *hash)

{
  long lVar1;
  uint8_t local_38 [8];
  uint8_t buf [8];
  size_t padbytes;
  uint64_t digested_bits;
  uint64_t digested_bytes;
  uint8_t *hash_local;
  cf_sha512_context *ctx_local;
  
  lVar1 = (ulong)ctx->blocks * 0x80 + ctx->npartial;
  buf = (uint8_t  [8])(0x80 - (lVar1 + 0x10U & 0x7f));
  cf_blockwise_acc_pad
            (ctx->partial,&ctx->npartial,0x80,0x80,'\0','\0',(size_t)buf,sha512_update_block,ctx);
  write64_be(0,local_38);
  cf_sha512_update(ctx,local_38,8);
  write64_be(lVar1 * 8,local_38);
  cf_sha512_update(ctx,local_38,8);
  if (ctx->npartial != 0) {
    abort();
  }
  write64_be(ctx->H[0],hash);
  write64_be(ctx->H[1],hash + 8);
  write64_be(ctx->H[2],hash + 0x10);
  write64_be(ctx->H[3],hash + 0x18);
  write64_be(ctx->H[4],hash + 0x20);
  write64_be(ctx->H[5],hash + 0x28);
  write64_be(ctx->H[6],hash + 0x30);
  write64_be(ctx->H[7],hash + 0x38);
  memset(ctx,0,0xd0);
  return;
}

Assistant:

void cf_sha512_digest_final(cf_sha512_context *ctx, uint8_t hash[CF_SHA512_HASHSZ])
{
  uint64_t digested_bytes = ctx->blocks;
  digested_bytes = digested_bytes * CF_SHA512_BLOCKSZ + ctx->npartial;
  uint64_t digested_bits = digested_bytes * 8;

  size_t padbytes = CF_SHA512_BLOCKSZ - ((digested_bytes + 16) % CF_SHA512_BLOCKSZ);

  /* Hash 0x80 00 ... block first. */
  cf_blockwise_acc_pad(ctx->partial, &ctx->npartial, sizeof ctx->partial,
                       0x80, 0x00, 0x00, padbytes,
                       sha512_update_block, ctx);

  /* Now hash length (this is 128 bits long). */
  uint8_t buf[8];
  write64_be(0, buf);
  cf_sha512_update(ctx, buf, 8);
  write64_be(digested_bits, buf);
  cf_sha512_update(ctx, buf, 8);

  /* We ought to have got our padding calculation right! */
  assert(ctx->npartial == 0);

  write64_be(ctx->H[0], hash + 0);
  write64_be(ctx->H[1], hash + 8);
  write64_be(ctx->H[2], hash + 16);
  write64_be(ctx->H[3], hash + 24);
  write64_be(ctx->H[4], hash + 32);
  write64_be(ctx->H[5], hash + 40);
  write64_be(ctx->H[6], hash + 48);
  write64_be(ctx->H[7], hash + 56);
  memset(ctx, 0, sizeof *ctx);
}